

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O0

void __thiscall
booster::aio::basic_socket::set_option(basic_socket *this,boolean_option_type opt,bool v)

{
  error_code eVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined1 in_DL;
  undefined4 in_ESI;
  error_code *in_RDI;
  error_code e;
  system_error *in_stack_ffffffffffffffc0;
  error_code *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  boolean_option_type in_stack_ffffffffffffffec;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar4;
  
  uVar4 = CONCAT13(in_DL,in_stack_fffffffffffffff0) & 0x1ffffff;
  std::error_code::error_code(in_RDI);
  set_option((basic_socket *)CONCAT44(in_ESI,uVar4),in_stack_ffffffffffffffec,
             SUB41((uint)in_stack_ffffffffffffffe8 >> 0x18,0),in_stack_ffffffffffffffe0);
  bVar2 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe0);
  if (!bVar2) {
    return;
  }
  uVar3 = __cxa_allocate_exception(0x40);
  eVar1._M_cat._4_4_ = in_stack_ffffffffffffffec;
  eVar1._M_cat._0_4_ = in_stack_ffffffffffffffe8;
  eVar1._0_8_ = in_stack_ffffffffffffffe0;
  system::system_error::system_error(in_stack_ffffffffffffffc0,eVar1);
  __cxa_throw(uVar3,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

void basic_socket::set_option(boolean_option_type opt,bool v)
{
	system::error_code e;
	set_option(opt,v,e);
	if(e) throw system::system_error(e);
}